

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3DbMallocRawNN(sqlite3 *db,u64 n)

{
  LookasideSlot *pLVar1;
  void *pvVar2;
  LookasideSlot *pBuf;
  u64 n_local;
  sqlite3 *db_local;
  
  if ((db->lookaside).bDisable == 0) {
    if ((db->lookaside).sz < n) {
      (db->lookaside).anStat[1] = (db->lookaside).anStat[1] + 1;
    }
    else {
      pLVar1 = (db->lookaside).pFree;
      if (pLVar1 != (LookasideSlot *)0x0) {
        (db->lookaside).pFree = pLVar1->pNext;
        (db->lookaside).nOut = (db->lookaside).nOut + 1;
        (db->lookaside).anStat[0] = (db->lookaside).anStat[0] + 1;
        if ((db->lookaside).nOut <= (db->lookaside).mxOut) {
          return pLVar1;
        }
        (db->lookaside).mxOut = (db->lookaside).nOut;
        return pLVar1;
      }
      (db->lookaside).anStat[2] = (db->lookaside).anStat[2] + 1;
    }
  }
  else if (db->mallocFailed != '\0') {
    return (void *)0x0;
  }
  pvVar2 = dbMallocRawFinish(db,n);
  return pvVar2;
}

Assistant:

SQLITE_PRIVATE void *sqlite3DbMallocRawNN(sqlite3 *db, u64 n){
#ifndef SQLITE_OMIT_LOOKASIDE
  LookasideSlot *pBuf;
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->lookaside.bDisable==0 ){
    assert( db->mallocFailed==0 );
    if( n>db->lookaside.sz ){
      db->lookaside.anStat[1]++;
    }else if( (pBuf = db->lookaside.pFree)==0 ){
      db->lookaside.anStat[2]++;
    }else{
      db->lookaside.pFree = pBuf->pNext;
      db->lookaside.nOut++;
      db->lookaside.anStat[0]++;
      if( db->lookaside.nOut>db->lookaside.mxOut ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      return (void*)pBuf;
    }
  }else if( db->mallocFailed ){
    return 0;
  }
#else
  assert( db!=0 );
  assert( sqlite3_mutex_held(db->mutex) );
  assert( db->pnBytesFreed==0 );
  if( db->mallocFailed ){
    return 0;
  }
#endif
  return dbMallocRawFinish(db, n);
}